

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::_process_ini(App *this)

{
  Option *this_00;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> local_30;
  
  this_00 = this->config_ptr_;
  if (this_00 != (Option *)0x0) {
    if ((this_00->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this_00->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      Option::run_callback(this_00);
      this->config_required_ = true;
    }
    if ((this->config_name_)._M_string_length != 0) {
      Config::from_file(&local_30,
                        (this->config_formatter_).
                        super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &this->config_name_);
      _parse_config(this,&local_30);
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector(&local_30);
    }
  }
  return;
}

Assistant:

void _process_ini() {
        // Process an INI file
        if(config_ptr_ != nullptr) {
            if(*config_ptr_) {
                config_ptr_->run_callback();
                config_required_ = true;
            }
            if(!config_name_.empty()) {
                try {
                    std::vector<ConfigItem> values = config_formatter_->from_file(config_name_);
                    _parse_config(values);
                } catch(const FileError &) {
                    if(config_required_)
                        throw;
                }
            }
        }
    }